

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# co_routine.cpp
# Opt level: O2

int co_create(stCoRoutine_t **ppco,stCoRoutineAttr_t *attr,pfn_co_routine_t pfn,void *arg)

{
  stCoRoutine_t *psVar1;
  stCoRoutineEnv_t *env;
  long in_FS_OFFSET;
  
  env = *(stCoRoutineEnv_t **)(in_FS_OFFSET + -0x10);
  if (env == (stCoRoutineEnv_t *)0x0) {
    co_init_curr_thread_env();
    env = *(stCoRoutineEnv_t **)(in_FS_OFFSET + -0x10);
  }
  psVar1 = co_create_env(env,attr,pfn,arg);
  *ppco = psVar1;
  return 0;
}

Assistant:

int co_create( stCoRoutine_t **ppco,const stCoRoutineAttr_t *attr,pfn_co_routine_t pfn,void *arg )
{
	if( !co_get_curr_thread_env() ) 
	{
		co_init_curr_thread_env();
	}
	stCoRoutine_t *co = co_create_env( co_get_curr_thread_env(), attr, pfn,arg );
	*ppco = co;
	return 0;
}